

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::FindHelper<true,false>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  BOOL BVar8;
  Var pvVar9;
  RecyclableObject *callBackFn;
  undefined4 *puVar10;
  uint64 uVar11;
  uint64 uVar12;
  JavascriptMethod p_Var13;
  undefined4 extraout_var;
  char16_t *varName;
  int iVar14;
  ulong uVar15;
  undefined1 *puVar16;
  undefined1 local_90 [8];
  JsReentLock jsReentLock;
  Var element;
  undefined1 *local_60;
  TypedArrayBase *local_48;
  
  local_90 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_90)->noJsReentrancy;
  ((ThreadContext *)local_90)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_90,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00ba679c:
    varName = L"[TypedArray].prototype.findIndex";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.findIndex";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar9 = Arguments::operator[](args,1);
  bVar5 = JavascriptConversion::IsCallable(pvVar9);
  if (!bVar5) goto LAB_00ba679c;
  pvVar9 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar9);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    element = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    element = Arguments::operator[](args,2);
  }
  local_48 = typedArrayBase;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar5) {
      local_48 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      local_48 = (TypedArrayBase *)0x0;
    }
  }
  jsReentLock.m_savedNoJsReentrancy = false;
  jsReentLock._25_7_ = 0;
  puVar16 = local_60;
  if (pArr == (JavascriptArray *)0x0) {
    if (local_48 == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_60 = (undefined1 *)
                 FindObjectHelper<true,false>(obj,length,0,callBackFn,element,scriptContext);
      goto LAB_00ba6770;
    }
    if (0xffffffff < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2148,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) goto LAB_00ba67c1;
      *puVar10 = 0;
    }
    bVar5 = 0 < length;
    if (0 < length) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar15 = 0;
      do {
        jsReentLock._24_4_ =
             (*(local_48->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
               super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[0x72])(local_48,uVar15);
        jsReentLock._28_4_ = extraout_var;
        if ((int)uVar15 < 0) {
          dVar4 = (double)uVar15;
          uVar11 = NumberUtilities::ToSpecial(dVar4);
          bVar7 = NumberUtilities::IsNan(dVar4);
          if (((bVar7) && (uVar12 = NumberUtilities::ToSpecial(dVar4), uVar12 != 0xfff8000000000000)
              ) && (uVar12 = NumberUtilities::ToSpecial(dVar4), uVar12 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar10 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar7) goto LAB_00ba67c1;
            *puVar10 = 0;
          }
          puVar16 = (undefined1 *)(uVar11 ^ 0xfffc000000000000);
        }
        else {
          puVar16 = (undefined1 *)(uVar15 | 0x1000000000000);
        }
        *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = scriptContext->threadContext;
        bVar7 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var13 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var13);
        p_Var13 = RecyclableObject::GetEntryPoint(callBackFn);
        pvVar9 = (*p_Var13)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,element,
                            jsReentLock._24_8_,puVar16,local_48);
        pTVar2->reentrancySafeOrHandled = bVar7;
        JsReentLock::MutateArrayObject((JsReentLock *)local_90);
        *(bool *)((long)local_90 + 0x108) = true;
        BVar8 = JavascriptConversion::ToBoolean(pvVar9,scriptContext);
        if (BVar8 != 0) break;
        uVar15 = (ulong)((int)uVar15 + 1);
        bVar5 = (long)uVar15 < length;
        puVar16 = local_60;
      } while ((long)uVar15 < length);
    }
  }
  else {
    pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    if (0xffffffff < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2125,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) {
LAB_00ba67c1:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    bVar5 = 0 < length;
    if (0 < length) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar15 = 0;
      do {
        *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        iVar14 = (int)uVar15;
        jsReentLock._24_8_ = pRVar1;
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                  (pArr,uVar15,&jsReentLock.m_savedNoJsReentrancy);
        JsReentLock::MutateArrayObject((JsReentLock *)local_90);
        *(bool *)((long)local_90 + 0x108) = true;
        if (iVar14 < 0) {
          dVar4 = (double)uVar15;
          uVar11 = NumberUtilities::ToSpecial(dVar4);
          bVar7 = NumberUtilities::IsNan(dVar4);
          if (((bVar7) && (uVar12 = NumberUtilities::ToSpecial(dVar4), uVar12 != 0xfff8000000000000)
              ) && (uVar12 = NumberUtilities::ToSpecial(dVar4), uVar12 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar10 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar7) goto LAB_00ba67c1;
            *puVar10 = 0;
          }
          puVar16 = (undefined1 *)(uVar11 ^ 0xfffc000000000000);
        }
        else {
          puVar16 = (undefined1 *)(uVar15 | 0x1000000000000);
        }
        *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = scriptContext->threadContext;
        bVar7 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var13 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var13);
        p_Var13 = RecyclableObject::GetEntryPoint(callBackFn);
        pvVar9 = (*p_Var13)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,element,
                            jsReentLock._24_8_,puVar16,pArr);
        pTVar2->reentrancySafeOrHandled = bVar7;
        JsReentLock::MutateArrayObject((JsReentLock *)local_90);
        *(bool *)((long)local_90 + 0x108) = true;
        BVar8 = JavascriptConversion::ToBoolean(pvVar9,scriptContext);
        if (BVar8 == 0) {
          bVar6 = IsNonES5Array(obj);
          bVar7 = true;
          if (!bVar6) {
            bVar7 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
            if (!bVar7) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar10 = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x2141,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar7) goto LAB_00ba67c1;
              *puVar10 = 0;
            }
            *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            local_60 = (undefined1 *)
                       FindObjectHelper<true,false>
                                 (obj,length,(ulong)(iVar14 + 1),callBackFn,element,scriptContext);
            bVar7 = false;
          }
        }
        else {
          bVar7 = false;
          local_60 = puVar16;
        }
        puVar16 = local_60;
        if (!bVar7) break;
        uVar15 = (ulong)(iVar14 + 1);
        bVar5 = (long)uVar15 < length;
      } while ((long)uVar15 < length);
    }
  }
  local_60 = puVar16;
  if (!bVar5) {
    local_60 = &DAT_10000ffffffff;
  }
LAB_00ba6770:
  *(undefined1 *)((long)local_90 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_60;
}

Assistant:

Var JavascriptArray::FindHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("[TypedArray].prototype.findIndex") : _u("[TypedArray].prototype.find"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("Array.prototype.findIndex") : _u("Array.prototype.find"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.find/findIndex and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        CallFlags flags = CallFlags_Value;
        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : 0;
        int8 loopDelta = reversed ? -1 : 1;

        if (pArr)
        {
            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k += loopDelta)
            {
                element = undefined;
                JS_REENTRANT(jsReentLock, pArr->DirectGetItemAtFull(k, &element));

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                                element,
                                index,
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, k + 1, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase)
        {
            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k+= loopDelta)
            {
                // Spec does not ask to call HasItem, so we need to go to visit the whole length

                element = typedArrayBase->DirectGetItem(k);

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                            element,
                            index,
                            typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }